

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestResolveWithLastItem(ImGuiNavItemData *result)

{
  ImGuiContext *g;
  ImGuiNavItemData *result_local;
  
  GImGui->NavMoveScoringItems = false;
  NavApplyItemToResult(result);
  NavUpdateAnyRequestFlag();
  return;
}

Assistant:

void ImGui::NavMoveRequestResolveWithLastItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    g.NavMoveScoringItems = false; // Ensure request doesn't need more processing
    NavApplyItemToResult(result);
    NavUpdateAnyRequestFlag();
}